

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

shared_ptr<inja::ExpressionNode> __thiscall
inja::Parser::parse_expression(Parser *this,Template *tmpl)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>_>_>_>
  *this_00;
  int iVar1;
  _Base_ptr p_Var2;
  shared_ptr<inja::ExpressionNode> *psVar3;
  element_type *peVar4;
  bool bVar5;
  undefined4 uVar6;
  _Elt_pointer psVar7;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<inja::ExpressionNode> sVar8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_09;
  string_view name;
  long local_148;
  long local_140;
  shared_ptr<inja::FunctionNode> function_node;
  shared_ptr<inja::ExpressionNode> expr;
  Operation operation;
  MinusState MStack_ec;
  basic_string_view<char,_std::char_traits<char>_> *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  Parser *local_a8;
  ExpressionListNode *local_a0;
  Arguments arguments;
  OperatorStack operator_stack;
  
  arguments.
  super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arguments.
  super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arguments.
  super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8 = this;
  ::std::
  stack<std::shared_ptr<inja::FunctionNode>,std::deque<std::shared_ptr<inja::FunctionNode>,std::allocator<std::shared_ptr<inja::FunctionNode>>>>
  ::
  stack<std::deque<std::shared_ptr<inja::FunctionNode>,std::allocator<std::shared_ptr<inja::FunctionNode>>>,void>
            (&operator_stack);
  this_00 = &tmpl->block_storage;
  local_d0 = (basic_string_view<char,_std::char_traits<char>_> *)
             &(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header;
  local_a0 = (ExpressionListNode *)&tmpl[1].root.super_AstNode.pos;
  local_140 = 0;
  local_148 = 0;
  do {
    uVar6 = *(undefined4 *)&(this_00->_M_t)._M_impl;
    switch(uVar6) {
    case 9:
      get_peek_token((Parser *)tmpl);
      __y_00._M_str = "true";
      __y_00._M_len = 4;
      bVar5 = ::std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)
                                 &(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header
                                ,__y_00);
      if (((bVar5) ||
          (__y_01._M_str = "false", __y_01._M_len = 5,
          bVar5 = ::std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)
                                     &(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header.
                                      _M_header,__y_01), bVar5)) ||
         (__y_02._M_str = "null", __y_02._M_len = 4,
         bVar5 = ::std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)
                                    &(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header.
                                     _M_header,__y_02), bVar5)) goto switchD_0014d885_caseD_a;
      __y_05._M_str = "and";
      __y_05._M_len = 3;
      bVar5 = ::std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)
                                 &(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header
                                ,__y_05);
      if (((bVar5) ||
          (__y_06._M_str = "or", __y_06._M_len = 2,
          bVar5 = ::std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)
                                     &(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header.
                                      _M_header,__y_06), bVar5)) ||
         ((__y_07._M_str = "in", __y_07._M_len = 2,
          bVar5 = ::std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)
                                     &(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header.
                                      _M_header,__y_07), bVar5 ||
          (__y_08._M_str = "not", __y_08._M_len = 3,
          bVar5 = ::std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)
                                     &(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header.
                                      _M_header,__y_08), bVar5)))) {
        uVar6 = *(undefined4 *)&(this_00->_M_t)._M_impl;
        goto switchD_0014d885_caseD_c;
      }
      if (*(int *)&(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
          0x15) {
        function_node.super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             ((long)(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent -
             *(long *)(in_RDX + 0x28));
        ::std::
        make_shared<inja::FunctionNode,std::basic_string_view<char,std::char_traits<char>>&,long>
                  ((basic_string_view<char,_std::char_traits<char>_> *)&expr,(long *)local_d0);
        get_next_token((Parser *)tmpl);
        do {
          get_next_token((Parser *)tmpl);
          parse_expression((Parser *)&function_node,tmpl);
          peVar4 = function_node.super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          if (function_node.super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr != (element_type *)0x0) {
            *(int *)&expr.super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr[4].super_AstNode._vptr_AstNode =
                 *(int *)&expr.super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr[4].super_AstNode._vptr_AstNode + 1;
            ::std::
            vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
            ::emplace_back<std::shared_ptr<inja::ExpressionNode>&>
                      ((vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
                        *)&expr.super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr[4].super_AstNode.pos,
                       (shared_ptr<inja::ExpressionNode> *)&function_node);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&function_node.
                      super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    );
          iVar1 = *(int *)&(this_00->_M_t)._M_impl;
        } while ((peVar4 != (element_type *)0x0) && (iVar1 == 0x12));
        if (iVar1 != 0x16) {
          Token::describe_abi_cxx11_((string *)&operation,(Token *)this_00);
          ::std::operator+(&local_c8,"expected right parenthesis, got \'",(string *)&operation);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &function_node,&local_c8,"\'");
          throw_parser_error((Parser *)tmpl,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &function_node);
          ::std::__cxx11::string::~string((string *)&function_node);
          ::std::__cxx11::string::~string((string *)&local_c8);
          ::std::__cxx11::string::~string((string *)&operation);
        }
        name._M_str = (char *)expr.
                              super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr[2].super_AstNode._vptr_AstNode;
        name._M_len = expr.super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr[2].super_AstNode.pos;
        FunctionStorage::find_function
                  ((FunctionData *)&function_node,
                   *(FunctionStorage **)((long)&(tmpl->content).field_2 + 8),name,
                   *(int *)&expr.
                            super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr[4].super_AstNode._vptr_AstNode);
        if ((int)function_node.super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr == 0x2f) {
          ::std::operator+(&local_c8,"unknown function ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (expr.
                            super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 2));
          throw_parser_error((Parser *)tmpl,&local_c8);
          ::std::__cxx11::string::~string((string *)&local_c8);
        }
        *(int *)&expr.super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1]
                 .super_AstNode.pos =
             (int)function_node.super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        if ((int)function_node.super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr == 0x2e) {
          std::
          function<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_(std::vector<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>_&)>
          ::operator=((function<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_(std::vector<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>_&)>
                       *)(expr.super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 6),
                      (function<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_(std::vector<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>_&)>
                       *)&function_node.
                          super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
        }
        ::std::
        vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
        ::emplace_back<std::shared_ptr<inja::FunctionNode>&>
                  ((vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
                    *)&arguments,(shared_ptr<inja::FunctionNode> *)&expr);
        std::_Function_base::~_Function_base
                  ((_Function_base *)
                   &function_node.super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        goto LAB_0014d9b8;
      }
      ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&function_node,local_d0,(allocator<char> *)&expr);
      _operation = (pointer)((long)(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header.
                                   _M_header._M_parent - *(long *)(in_RDX + 0x28));
      ::std::make_shared<inja::DataNode,std::__cxx11::string,long>(&local_c8,(long *)&function_node)
      ;
      ::std::
      vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
      ::emplace_back<std::shared_ptr<inja::DataNode>>
                ((vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
                  *)&arguments,(shared_ptr<inja::DataNode> *)&local_c8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c8._M_string_length);
      ::std::__cxx11::string::~string((string *)&function_node);
      break;
    case 10:
    case 0xb:
switchD_0014d885_caseD_a:
      if (local_140 == 0 && local_148 == 0) {
        p_Var2 = (_Base_ptr)local_d0->_M_str;
        (local_a0->super_AstNode)._vptr_AstNode = *(_func_int ***)&local_d0->_M_len;
        (local_a0->super_AstNode).pos = (size_t)p_Var2;
LAB_0014db7e:
        add_literal((Parser *)tmpl,&arguments,*(char **)(in_RDX + 0x28));
LAB_0014db92:
        local_140 = 0;
        local_148 = 0;
      }
      break;
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x13:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x20:
switchD_0014d885_caseD_c:
      switch(uVar6) {
      case 9:
        __y._M_str = "and";
        __y._M_len = 3;
        bVar5 = ::std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)
                                   &(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header.
                                    _M_header,__y);
        if (bVar5) {
          operation = 1;
        }
        else {
          __y_03._M_str = "or";
          __y_03._M_len = 2;
          bVar5 = ::std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)
                                     &(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header.
                                      _M_header,__y_03);
          if (bVar5) {
            operation = 2;
          }
          else {
            __y_04._M_str = "in";
            __y_04._M_len = 2;
            bVar5 = ::std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)
                                       &(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header.
                                        _M_header,__y_04);
            if (bVar5) {
              operation = 3;
            }
            else {
              __y_09._M_str = "not";
              __y_09._M_len = 3;
              bVar5 = ::std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)
                                         &(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header.
                                          _M_header,__y_09);
              if (!bVar5) {
                ::std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&function_node,"unknown operator in parser.",
                           (allocator<char> *)&local_c8);
                throw_parser_error((Parser *)tmpl,(string *)&function_node);
                goto LAB_0014dc5d;
              }
              _operation = _operation & 0xffffffff00000000;
            }
          }
        }
        break;
      default:
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&function_node,"unknown operator in parser.",
                   (allocator<char> *)&local_c8);
        throw_parser_error((Parser *)tmpl,(string *)&function_node);
LAB_0014dc5d:
        ::std::__cxx11::string::~string((string *)&function_node);
        break;
      case 0xc:
        operation = 10;
        break;
      case 0xd:
        operation = 0xb;
        break;
      case 0xe:
        operation = 0xc;
        break;
      case 0xf:
        operation = 0xd;
        break;
      case 0x10:
        operation = 0xf;
        break;
      case 0x11:
        operation = 0xe;
        break;
      case 0x13:
        operation = 0x10;
        break;
      case 0x1b:
        operation = 4;
        break;
      case 0x1c:
        operation = 5;
        break;
      case 0x1d:
        operation = 6;
        break;
      case 0x1e:
        operation = 7;
        break;
      case 0x1f:
        operation = 8;
        break;
      case 0x20:
        operation = 9;
      }
      local_c8._M_dataplus._M_p =
           (pointer)((long)(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_parent - *(long *)(in_RDX + 0x28));
      ::std::make_shared<inja::FunctionNode,inja::FunctionStorage::Operation&,long>
                ((Operation *)&function_node,(long *)&operation);
      while (operator_stack.c.
             super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             operator_stack.c.
             super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        psVar7 = operator_stack.c.
                 super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (operator_stack.c.
            super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            operator_stack.c.
            super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          psVar7 = operator_stack.c.
                   super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if ((psVar7[-1].super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            precedence <=
            (function_node.super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->precedence) {
          psVar7 = operator_stack.c.
                   super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (operator_stack.c.
              super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              operator_stack.c.
              super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            psVar7 = operator_stack.c.
                     super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          if (((psVar7[-1].super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->precedence !=
               (function_node.super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->precedence) ||
             ((function_node.super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->associativity != Left)) break;
        }
        add_operator((Parser *)tmpl,&arguments,&operator_stack);
      }
      ::std::
      deque<std::shared_ptr<inja::FunctionNode>,std::allocator<std::shared_ptr<inja::FunctionNode>>>
      ::emplace_back<std::shared_ptr<inja::FunctionNode>&>
                ((deque<std::shared_ptr<inja::FunctionNode>,std::allocator<std::shared_ptr<inja::FunctionNode>>>
                  *)&operator_stack,&function_node);
      psVar3 = (shared_ptr<inja::ExpressionNode> *)&function_node;
      goto LAB_0014dd18;
    case 0x12:
      if (local_140 == 0 && local_148 == 0) goto switchD_0014d885_caseD_16;
      break;
    case 0x14:
      if (local_140 == 0 && local_148 == 0) {
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&function_node,"unexpected \':\'",(allocator<char> *)&local_c8);
        throw_parser_error((Parser *)tmpl,(string *)&function_node);
        ::std::__cxx11::string::~string((string *)&function_node);
        goto LAB_0014db92;
      }
      break;
    case 0x15:
      get_next_token((Parser *)tmpl);
      parse_expression((Parser *)&expr,tmpl);
      if (*(int *)&(this_00->_M_t)._M_impl != 0x16) {
        Token::describe_abi_cxx11_((string *)&operation,(Token *)this_00);
        ::std::operator+(&local_c8,"expected right parenthesis, got \'",(string *)&operation);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &function_node,&local_c8,"\'");
        throw_parser_error((Parser *)tmpl,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &function_node);
        ::std::__cxx11::string::~string((string *)&function_node);
        ::std::__cxx11::string::~string((string *)&local_c8);
        ::std::__cxx11::string::~string((string *)&operation);
      }
      if (expr.super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&function_node,"empty expression in parentheses",
                   (allocator<char> *)&local_c8);
        throw_parser_error((Parser *)tmpl,(string *)&function_node);
        ::std::__cxx11::string::~string((string *)&function_node);
      }
      ::std::
      vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
      ::emplace_back<std::shared_ptr<inja::ExpressionNode>&>
                ((vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
                  *)&arguments,&expr);
LAB_0014d9b8:
      psVar3 = &expr;
LAB_0014dd18:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&(psVar3->super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount);
      break;
    default:
switchD_0014d885_caseD_16:
      while (operator_stack.c.
             super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             operator_stack.c.
             super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        add_operator((Parser *)tmpl,&arguments,&operator_stack);
      }
      local_a8->config = (ParserConfig *)0x0;
      (local_a8->lexer).config = (LexerConfig *)0x0;
      if ((long)arguments.
                super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)arguments.
                super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x10) {
        std::__shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2> *)local_a8,
                   &(arguments.
                     super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>);
        std::
        vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
        ::operator=(&arguments,(initializer_list<std::shared_ptr<inja::ExpressionNode>_>)ZEXT816(0))
        ;
      }
      else if (0x10 < (ulong)((long)arguments.
                                    super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)arguments.
                                   super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)) {
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&function_node,"malformed expression",(allocator<char> *)&local_c8);
        throw_parser_error((Parser *)tmpl,(string *)&function_node);
        ::std::__cxx11::string::~string((string *)&function_node);
      }
      std::
      deque<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
      ::~deque(&operator_stack.c);
      std::
      vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
      ::~vector(&arguments);
      sVar8.super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      sVar8.super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_a8;
      return (shared_ptr<inja::ExpressionNode>)
             sVar8.super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>;
    case 0x17:
      if (local_140 == 0 && local_148 == 0) {
        p_Var2 = (_Base_ptr)local_d0->_M_str;
        (local_a0->super_AstNode)._vptr_AstNode = *(_func_int ***)&local_d0->_M_len;
        (local_a0->super_AstNode).pos = (size_t)p_Var2;
      }
      local_148 = local_148 + 1;
      break;
    case 0x18:
      if (local_148 == 0) {
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&function_node,"unexpected \']\'",(allocator<char> *)&local_c8);
        throw_parser_error((Parser *)tmpl,(string *)&function_node);
        ::std::__cxx11::string::~string((string *)&function_node);
      }
      local_148 = local_148 + -1;
      if (local_140 == 0 && local_148 == 0) goto LAB_0014db7e;
      break;
    case 0x19:
      if (local_140 == 0 && local_148 == 0) {
        p_Var2 = (_Base_ptr)local_d0->_M_str;
        (local_a0->super_AstNode)._vptr_AstNode = *(_func_int ***)&local_d0->_M_len;
        (local_a0->super_AstNode).pos = (size_t)p_Var2;
      }
      local_140 = local_140 + 1;
      break;
    case 0x1a:
      if (local_140 == 0) {
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&function_node,"unexpected \'}\'",(allocator<char> *)&local_c8);
        throw_parser_error((Parser *)tmpl,(string *)&function_node);
        ::std::__cxx11::string::~string((string *)&function_node);
      }
      local_140 = local_140 + -1;
      if (local_140 == 0 && local_148 == 0) goto LAB_0014db7e;
    }
    get_next_token((Parser *)tmpl);
  } while( true );
}

Assistant:

std::shared_ptr<ExpressionNode> parse_expression(Template& tmpl) {
    size_t current_bracket_level {0};
    size_t current_brace_level {0};
    Arguments arguments;
    OperatorStack operator_stack;

    while (tok.kind != Token::Kind::Eof) {
      // Literals
      switch (tok.kind) {
      case Token::Kind::String: {
        if (current_brace_level == 0 && current_bracket_level == 0) {
          literal_start = tok.text;
          add_literal(arguments, tmpl.content.c_str());
        }
      } break;
      case Token::Kind::Number: {
        if (current_brace_level == 0 && current_bracket_level == 0) {
          literal_start = tok.text;
          add_literal(arguments, tmpl.content.c_str());
        }
      } break;
      case Token::Kind::LeftBracket: {
        if (current_brace_level == 0 && current_bracket_level == 0) {
          literal_start = tok.text;
        }
        current_bracket_level += 1;
      } break;
      case Token::Kind::LeftBrace: {
        if (current_brace_level == 0 && current_bracket_level == 0) {
          literal_start = tok.text;
        }
        current_brace_level += 1;
      } break;
      case Token::Kind::RightBracket: {
        if (current_bracket_level == 0) {
          throw_parser_error("unexpected ']'");
        }

        current_bracket_level -= 1;
        if (current_brace_level == 0 && current_bracket_level == 0) {
          add_literal(arguments, tmpl.content.c_str());
        }
      } break;
      case Token::Kind::RightBrace: {
        if (current_brace_level == 0) {
          throw_parser_error("unexpected '}'");
        }

        current_brace_level -= 1;
        if (current_brace_level == 0 && current_bracket_level == 0) {
          add_literal(arguments, tmpl.content.c_str());
        }
      } break;
      case Token::Kind::Id: {
        get_peek_token();

        // Data Literal
        if (tok.text == static_cast<decltype(tok.text)>("true") || tok.text == static_cast<decltype(tok.text)>("false") ||
            tok.text == static_cast<decltype(tok.text)>("null")) {
          if (current_brace_level == 0 && current_bracket_level == 0) {
            literal_start = tok.text;
            add_literal(arguments, tmpl.content.c_str());
          }

          // Operator
        } else if (tok.text == "and" || tok.text == "or" || tok.text == "in" || tok.text == "not") {
          goto parse_operator;

          // Functions
        } else if (peek_tok.kind == Token::Kind::LeftParen) {
          auto func = std::make_shared<FunctionNode>(tok.text, tok.text.data() - tmpl.content.c_str());
          get_next_token();
          do {
            get_next_token();
            auto expr = parse_expression(tmpl);
            if (!expr) {
              break;
            }
            func->number_args += 1;
            func->arguments.emplace_back(expr);
          } while (tok.kind == Token::Kind::Comma);
          if (tok.kind != Token::Kind::RightParen) {
            throw_parser_error("expected right parenthesis, got '" + tok.describe() + "'");
          }

          auto function_data = function_storage.find_function(func->name, func->number_args);
          if (function_data.operation == FunctionStorage::Operation::None) {
            throw_parser_error("unknown function " + func->name);
          }
          func->operation = function_data.operation;
          if (function_data.operation == FunctionStorage::Operation::Callback) {
            func->callback = function_data.callback;
          }
          arguments.emplace_back(func);

          // Variables
        } else {
          arguments.emplace_back(std::make_shared<DataNode>(static_cast<std::string>(tok.text), tok.text.data() - tmpl.content.c_str()));
        }

        // Operators
      } break;
      case Token::Kind::Equal:
      case Token::Kind::NotEqual:
      case Token::Kind::GreaterThan:
      case Token::Kind::GreaterEqual:
      case Token::Kind::LessThan:
      case Token::Kind::LessEqual:
      case Token::Kind::Plus:
      case Token::Kind::Minus:
      case Token::Kind::Times:
      case Token::Kind::Slash:
      case Token::Kind::Power:
      case Token::Kind::Percent:
      case Token::Kind::Dot: {

      parse_operator:
        FunctionStorage::Operation operation;
        switch (tok.kind) {
        case Token::Kind::Id: {
          if (tok.text == "and") {
            operation = FunctionStorage::Operation::And;
          } else if (tok.text == "or") {
            operation = FunctionStorage::Operation::Or;
          } else if (tok.text == "in") {
            operation = FunctionStorage::Operation::In;
          } else if (tok.text == "not") {
            operation = FunctionStorage::Operation::Not;
          } else {
            throw_parser_error("unknown operator in parser.");
          }
        } break;
        case Token::Kind::Equal: {
          operation = FunctionStorage::Operation::Equal;
        } break;
        case Token::Kind::NotEqual: {
          operation = FunctionStorage::Operation::NotEqual;
        } break;
        case Token::Kind::GreaterThan: {
          operation = FunctionStorage::Operation::Greater;
        } break;
        case Token::Kind::GreaterEqual: {
          operation = FunctionStorage::Operation::GreaterEqual;
        } break;
        case Token::Kind::LessThan: {
          operation = FunctionStorage::Operation::Less;
        } break;
        case Token::Kind::LessEqual: {
          operation = FunctionStorage::Operation::LessEqual;
        } break;
        case Token::Kind::Plus: {
          operation = FunctionStorage::Operation::Add;
        } break;
        case Token::Kind::Minus: {
          operation = FunctionStorage::Operation::Subtract;
        } break;
        case Token::Kind::Times: {
          operation = FunctionStorage::Operation::Multiplication;
        } break;
        case Token::Kind::Slash: {
          operation = FunctionStorage::Operation::Division;
        } break;
        case Token::Kind::Power: {
          operation = FunctionStorage::Operation::Power;
        } break;
        case Token::Kind::Percent: {
          operation = FunctionStorage::Operation::Modulo;
        } break;
        case Token::Kind::Dot: {
          operation = FunctionStorage::Operation::AtId;
        } break;
        default: {
          throw_parser_error("unknown operator in parser.");
        }
        }
        auto function_node = std::make_shared<FunctionNode>(operation, tok.text.data() - tmpl.content.c_str());

        while (!operator_stack.empty() &&
               ((operator_stack.top()->precedence > function_node->precedence) ||
                (operator_stack.top()->precedence == function_node->precedence && function_node->associativity == FunctionNode::Associativity::Left))) {
          add_operator(arguments, operator_stack);
        }

        operator_stack.emplace(function_node);
      } break;
      case Token::Kind::Comma: {
        if (current_brace_level == 0 && current_bracket_level == 0) {
          goto break_loop;
        }
      } break;
      case Token::Kind::Colon: {
        if (current_brace_level == 0 && current_bracket_level == 0) {
          throw_parser_error("unexpected ':'");
        }
      } break;
      case Token::Kind::LeftParen: {
        get_next_token();
        auto expr = parse_expression(tmpl);
        if (tok.kind != Token::Kind::RightParen) {
            throw_parser_error("expected right parenthesis, got '" + tok.describe() + "'");
        }
        if (!expr) {
          throw_parser_error("empty expression in parentheses");
        }
        arguments.emplace_back(expr);
      } break;
      default:
        goto break_loop;
      }

      get_next_token();
    }

  break_loop:
    while (!operator_stack.empty()) {
      add_operator(arguments, operator_stack);
    }

    std::shared_ptr<ExpressionNode> expr;
    if (arguments.size() == 1) {
      expr = arguments[0];
      arguments = {};
    } else if (arguments.size() > 1) {
      throw_parser_error("malformed expression");
    }
    return expr;
  }